

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O2

int cfg_tobin_netaddr(void *reference,size_t bin_size,const_strarray *value)

{
  int iVar1;
  
  if (bin_size == 0x12) {
    iVar1 = netaddr_from_string(reference,value->value);
    return iVar1;
  }
  return -1;
}

Assistant:

int
cfg_tobin_netaddr(void *reference, size_t bin_size, const struct const_strarray *value) {
  struct netaddr *ptr;

  if (bin_size != sizeof(*ptr)) {
    return -1;
  }

  ptr = (struct netaddr *)reference;

  return netaddr_from_string(ptr, strarray_get_first_c(value));
}